

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

Type * LLVMBC::Type::getTy(LLVMContext *context,TypeID id)

{
  bool bVar1;
  TypeID TVar2;
  Vector<Type_*> *this;
  reference ppTVar3;
  LLVMContext *local_50;
  Type *type;
  Type *type_1;
  iterator __end1;
  iterator __begin1;
  Vector<Type_*> *__range1;
  Vector<Type_*> *cache;
  LLVMContext *pLStack_18;
  TypeID id_local;
  LLVMContext *context_local;
  
  cache._4_4_ = id;
  pLStack_18 = context;
  this = LLVMContext::get_type_cache(context);
  __end1 = std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::begin(this)
  ;
  type_1 = (Type *)std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::end
                             (this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<LLVMBC::Type_**,_std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>_>
                                *)&type_1);
    if (!bVar1) {
      local_50 = (LLVMContext *)
                 LLVMContext::construct<LLVMBC::Type,LLVMBC::LLVMContext&,LLVMBC::Type::TypeID&>
                           (pLStack_18,pLStack_18,(TypeID *)((long)&cache + 4));
      std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::push_back
                (this,(value_type *)&local_50);
      return (Type *)local_50;
    }
    ppTVar3 = __gnu_cxx::
              __normal_iterator<LLVMBC::Type_**,_std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>_>
              ::operator*(&__end1);
    type = *ppTVar3;
    TVar2 = getTypeID(type);
    if (TVar2 == cache._4_4_) break;
    __gnu_cxx::
    __normal_iterator<LLVMBC::Type_**,_std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>_>
    ::operator++(&__end1);
  }
  return type;
}

Assistant:

Type *Type::getTy(LLVMContext &context, TypeID id)
{
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
		if (type->getTypeID() == id)
			return type;

	auto *type = context.construct<Type>(context, id);
	cache.push_back(type);
	return type;
}